

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

vector<folding_set,_std::allocator<folding_set>_> *
folding_sets_from_folding_info
          (vector<folding_set,_std::allocator<folding_set>_> *__return_storage_ptr__,
          vector<folding_info,_std::allocator<folding_info>_> *in_info)

{
  pointer *ppfVar1;
  pointer pfVar2;
  iterator iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint in_ECX;
  long lVar7;
  folding_info *info;
  pointer pfVar8;
  folding_set local_48;
  
  uVar6 = 0;
  (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.range_start = 0;
  local_48.mode = single;
  pfVar8 = (in_info->super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (in_info->super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_48.range_end = in_ECX;
  local_48.diff = 0;
  do {
    if (pfVar8 == pfVar2) {
      local_48._12_4_ = 0;
      if (local_48.diff != 0) {
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_48.range_end = uVar6;
          std::vector<folding_set,std::allocator<folding_set>>::
          _M_realloc_insert<folding_set_const&>
                    ((vector<folding_set,std::allocator<folding_set>> *)__return_storage_ptr__,iVar3
                     ,&local_48);
        }
        else {
          (iVar3._M_current)->diff = local_48.diff;
          (iVar3._M_current)->mode = local_48.mode;
          (iVar3._M_current)->range_start = local_48.range_start;
          *(ulong *)&(iVar3._M_current)->range_end = (ulong)uVar6;
          ppfVar1 = &(__return_storage_ptr__->
                     super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppfVar1 = *ppfVar1 + 1;
        }
      }
      return __return_storage_ptr__;
    }
    local_48._12_4_ = 0;
    uVar6 = pfVar8->in_codepoint;
    lVar7 = (ulong)pfVar8->out_codepoint - (ulong)uVar6;
    uVar5 = uVar6;
    lVar4 = lVar7;
    if (local_48.diff != 0) {
      uVar5 = local_48.range_start;
      lVar4 = local_48.diff;
      if (local_48.mode == single) {
        if (uVar6 == local_48.range_end + 1 && lVar7 == local_48.diff) {
          local_48.mode = constant;
        }
        else {
          if (uVar6 != local_48.range_end + 2 || lVar7 != local_48.diff) goto LAB_0020627b;
          local_48.mode = alternating;
        }
      }
      else {
LAB_0020627b:
        if ((((local_48.mode != constant) || (local_48.diff != lVar7)) ||
            (local_48.range_end + 1 != uVar6)) &&
           (((local_48.mode != alternating || (local_48.diff != lVar7)) ||
            (local_48.range_end + 2 != uVar6)))) {
          iVar3._M_current =
               (__return_storage_ptr__->
               super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (__return_storage_ptr__->super__Vector_base<folding_set,_std::allocator<folding_set>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<folding_set,std::allocator<folding_set>>::
            _M_realloc_insert<folding_set_const&>
                      ((vector<folding_set,std::allocator<folding_set>> *)__return_storage_ptr__,
                       iVar3,&local_48);
          }
          else {
            (iVar3._M_current)->diff = local_48.diff;
            (iVar3._M_current)->mode = local_48.mode;
            (iVar3._M_current)->range_start = local_48.range_start;
            *(ulong *)&(iVar3._M_current)->range_end = (ulong)local_48.range_end;
            ppfVar1 = &(__return_storage_ptr__->
                       super__Vector_base<folding_set,_std::allocator<folding_set>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppfVar1 = *ppfVar1 + 1;
          }
          local_48.mode = single;
          uVar6 = pfVar8->in_codepoint;
          uVar5 = uVar6;
          lVar4 = lVar7;
        }
      }
    }
    local_48.range_start = uVar5;
    pfVar8 = pfVar8 + 1;
    local_48.range_end = uVar6;
    local_48.diff = lVar4;
  } while( true );
}

Assistant:

std::vector<folding_set> folding_sets_from_folding_info(const std::vector<folding_info>& in_info) {
	std::vector<folding_set> result;

	folding_set current{};
	uint32_t last_match;
	for (auto& info : in_info) {
		int64_t diff = static_cast<int64_t>(info.out_codepoint) - static_cast<int64_t>(info.in_codepoint);

		if (current.diff == 0) {
			// this is a new set; set range_start and diff
			current.range_start = info.in_codepoint;
			current.diff = diff;
			last_match = info.in_codepoint;
			continue;
		}

		if (current.mode == folding_set::mode_type::single) {
			// We don't know what mode we are yet; check if this is constant
			if (diff == current.diff
				&& info.in_codepoint == last_match + 1) {
				// diff is same for range_start + 1; must be a constant-diff continuous set
				current.mode = folding_set::mode_type::constant;
				last_match = info.in_codepoint;
				continue;
			}

			// Either one-off fold, or alternating set. Check if in_codepoint is last_match + 2
			if (diff == current.diff
				&& info.in_codepoint == last_match + 2) {
				// Looks like an alternating set
				current.mode = folding_set::mode_type::alternating;
				last_match = info.in_codepoint;
				continue;
			}
		}

		if (current.mode == folding_set::mode_type::constant // For constant offset diffs to continue...
			&& current.diff == diff // Diff must be the same
			&& last_match + 1 == info.in_codepoint) { // And current codepoint must be 1 higher than previous
			// This matches the current range pattern; just update last_match and carry on
			last_match = info.in_codepoint;
			continue;
		}

		if (current.mode == folding_set::mode_type::alternating // For alternating sets to continue...
			&& current.diff == diff // Diff must be same
			&& last_match + 2 == info.in_codepoint) { // And current codepoint must be 2 higher than previous
			last_match = info.in_codepoint;
			continue;
		}

		// This isn't a continuation of the current set; push current and start a new set
		current.range_end = last_match;
		result.push_back(current);

		current = folding_set{};
		current.range_start = info.in_codepoint;
		current.diff = diff;
		last_match = info.in_codepoint;
	}

	// Push final range
	if (current.diff != 0) {
		current.range_end = last_match;
		result.push_back(current);
	}

	return result;
}